

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O0

void pq_add(roaring_pq_t *pq,roaring_pq_element_t *t)

{
  long lVar1;
  _Bool _Var2;
  uint64_t *puVar3;
  roaring_pq_element_t *in_RSI;
  long *in_RDI;
  roaring_pq_element_t ap;
  uint64_t p;
  uint64_t i;
  roaring_pq_element_t local_38;
  ulong local_20;
  ulong local_18;
  roaring_pq_element_t *local_10;
  long *local_8;
  
  local_18 = in_RDI[1];
  lVar1 = in_RDI[1];
  in_RDI[1] = lVar1 + 1;
  puVar3 = (uint64_t *)(*in_RDI + lVar1 * 0x18);
  *puVar3 = in_RSI->size;
  puVar3[1] = *(uint64_t *)&in_RSI->is_temporary;
  puVar3[2] = (uint64_t)in_RSI->bitmap;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_18 != 0) {
    local_20 = local_18 - 1 >> 1;
    puVar3 = (uint64_t *)(*local_8 + local_20 * 0x18);
    local_38.size = *puVar3;
    local_38._8_8_ = puVar3[1];
    local_38.bitmap = (roaring_bitmap_t *)puVar3[2];
    _Var2 = compare(local_10,&local_38);
    if (!_Var2) break;
    puVar3 = (uint64_t *)(*local_8 + local_18 * 0x18);
    *puVar3 = local_38.size;
    puVar3[1] = local_38._8_8_;
    puVar3[2] = (uint64_t)local_38.bitmap;
    local_18 = local_20;
  }
  puVar3 = (uint64_t *)(*local_8 + local_18 * 0x18);
  *puVar3 = local_10->size;
  puVar3[1] = *(uint64_t *)&local_10->is_temporary;
  puVar3[2] = (uint64_t)local_10->bitmap;
  return;
}

Assistant:

static void pq_add(roaring_pq_t *pq, roaring_pq_element_t *t) {
    uint64_t i = pq->size;
    pq->elements[pq->size++] = *t;
    while (i > 0) {
        uint64_t p = (i - 1) >> 1;
        roaring_pq_element_t ap = pq->elements[p];
        if (!compare(t, &ap)) break;
        pq->elements[i] = ap;
        i = p;
    }
    pq->elements[i] = *t;
}